

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

void __thiscall icu_63::FCDUIterCollationIterator::switchToBackward(FCDUIterCollationIterator *this)

{
  int32_t iVar1;
  FCDUIterCollationIterator *this_local;
  
  if (this->state == ITER_CHECK_FWD) {
    iVar1 = (*((this->super_UIterCollationIterator).iter)->getIndex)
                      ((this->super_UIterCollationIterator).iter,UITER_CURRENT);
    this->pos = iVar1;
    this->limit = iVar1;
    if (this->pos == this->start) {
      this->state = ITER_CHECK_BWD;
    }
    else {
      this->state = ITER_IN_FCD_SEGMENT;
    }
  }
  else {
    if (this->state != ITER_IN_FCD_SEGMENT) {
      if (this->state == IN_NORM_ITER_AT_LIMIT) {
        (*((this->super_UIterCollationIterator).iter)->move)
                  ((this->super_UIterCollationIterator).iter,this->start - this->limit,UITER_CURRENT
                  );
      }
      this->limit = this->start;
    }
    this->state = ITER_CHECK_BWD;
  }
  return;
}

Assistant:

void
FCDUIterCollationIterator::switchToBackward() {
    U_ASSERT(state == ITER_CHECK_FWD ||
             (state == ITER_IN_FCD_SEGMENT && pos == start) ||
             (state >= IN_NORM_ITER_AT_LIMIT && pos == 0));
    if(state == ITER_CHECK_FWD) {
        // Turn around from forward checking.
        limit = pos = iter.getIndex(&iter, UITER_CURRENT);
        if(pos == start) {
            state = ITER_CHECK_BWD;  // Check backward.
        } else {  // pos > start
            state = ITER_IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the start of the FCD segment.
        if(state == ITER_IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it backward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking backward from it.
            if(state == IN_NORM_ITER_AT_LIMIT) {
                iter.move(&iter, start - limit, UITER_CURRENT);
            }
            limit = start;
        }
        state = ITER_CHECK_BWD;
    }
}